

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O0

void AString_replace(AString *str,char old,char rep,size_t count)

{
  ulong local_28;
  size_t i;
  size_t count_local;
  char rep_local;
  char old_local;
  AString *str_local;
  
  if (str != (AString *)0x0) {
    local_28 = 0;
    i = count;
    while ((local_28 < str->size &&
           (((str->buffer[local_28] != old || (str->buffer[local_28] = rep, i == 0)) ||
            (i = i - 1, i != 0))))) {
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

ACUTILS_HD_FUNC void AString_replace(struct AString *str, char old, char rep, size_t count)
{
    size_t i;
    if(str == nullptr)
        return;
    for(i = 0; i < str->size; ++i) {
        if(str->buffer[i] == old) {
            str->buffer[i] = rep;
            if(count > 0 && --count == 0)
                return;
        }
    }
}